

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routes.c
# Opt level: O0

int exec_route(char *prefix,mg_connection *conn)

{
  int iVar1;
  char local_430 [8];
  route aux;
  int rc;
  int i;
  mg_connection *conn_local;
  char *prefix_local;
  
  aux.fn._4_4_ = 0;
  while( true ) {
    if (aux.prefix._1016_8_ == 0) {
      return 0x194;
    }
    memcpy(local_430,route_array + aux.fn._4_4_,0x408);
    aux.fn._0_4_ = strcmp(local_430,prefix);
    if ((int)aux.fn == 0) break;
    aux.fn._4_4_ = aux.fn._4_4_ + 1;
  }
  iVar1 = (*(code *)aux.prefix._1016_8_)(conn);
  return iVar1;
}

Assistant:

int exec_route(const char *prefix, struct mg_connection *conn) {
	int i, rc;
	route aux;

	for (i = 0; aux.fn != NULL; i++) {
		aux = route_array[i];
		if ((rc = strcmp(aux.prefix, prefix)) == 0) {
			return aux.fn(conn);
		}
	}

	return 404;
}